

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O2

double Open_JTalk_get_speed(Open_JTalk *open_jtalk,_Bool *error)

{
  if (error == (_Bool *)0x0) {
    if (open_jtalk != (Open_JTalk *)0x0) goto LAB_0014f2cc;
  }
  else {
    *error = false;
    if (open_jtalk != (Open_JTalk *)0x0) {
LAB_0014f2cc:
      return (open_jtalk->engine).condition.speed;
    }
    *error = true;
  }
  return 0.0;
}

Assistant:

double Open_JTalk_get_speed(Open_JTalk *open_jtalk, bool *error)
{
	if (error)
	{
		*error = false;
	}

	if (open_jtalk == NULL)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	return open_jtalk->engine.condition.speed;
}